

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O3

string * __thiscall
soul::CompileMessage::getAnnotatedSourceLine_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  long lVar1;
  LineAndColumn LVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string indent;
  string sourceLine;
  long *local_a8 [2];
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  string local_48;
  
  if ((this->location).location.data != (char *)0x0) {
    LVar2 = CodeLocation::getLineAndColumn(&this->location);
    if ((ulong)LVar2 >> 0x20 != 0) {
      CodeLocation::getSourceLine_abi_cxx11_(&local_48,&this->location);
      local_60 = 0;
      local_58 = 0;
      uVar7 = LVar2.column - 1;
      local_68 = &local_58;
      if (uVar7 != 0) {
        uVar6 = 0;
        do {
          std::__cxx11::string::push_back((char)&local_68);
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,local_48._M_dataplus._M_p,
                 local_48._M_dataplus._M_p + local_48._M_string_length);
      std::__cxx11::string::append((char *)local_a8);
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_68);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_78 = *plVar4;
        lStack_70 = plVar3[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar4;
        local_88 = (long *)*plVar3;
      }
      local_80 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar5) {
        lVar1 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0],local_98[0] + 1);
      }
      if (local_68 != &local_58) {
        operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getAnnotatedSourceLine() const
{
    if (location.location.getAddress() != nullptr)
    {
        auto lc = location.getLineAndColumn();

        if (lc.column != 0)
        {
            auto sourceLine = location.getSourceLine();
            std::string indent;

            // because some fools insist on using tab characters, we need to make sure we mirror
            // any tabs in the original source line when indenting the '^' character, so that when
            // it's printed underneath it lines-up regardless of tab size
            for (size_t i = 0; i < lc.column - 1; ++i)
                indent += sourceLine[i] == '\t' ? '\t' : ' ';

            return sourceLine + "\n" + indent + "^";
        }
    }

    return {};
}